

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.c
# Opt level: O0

int do_dump(unsigned_long lflags,char_io *io_ch,void *arg,ASN1_STRING *str)

{
  int iVar1;
  int iVar2;
  char *file;
  _union_257 in_RCX;
  undefined8 in_RDX;
  code *in_RSI;
  ulong in_RDI;
  int der_len;
  int outlen;
  uchar *p;
  uchar *der_buf;
  ASN1_TYPE t;
  undefined4 in_stack_ffffffffffffffb4;
  uchar *in_stack_ffffffffffffffb8;
  int line;
  undefined8 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  _union_257 in_stack_ffffffffffffffd0;
  _union_257 io_ch_00;
  int local_4;
  
  line = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  iVar2 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  iVar1 = (*in_RSI)(in_RDX,"#",1);
  if (iVar1 == 0) {
    local_4 = -1;
  }
  else if ((in_RDI & 0x200) == 0) {
    local_4 = do_hex_dump((char_io *)in_RCX.ptr,in_stack_ffffffffffffffd0.ptr,
                          (uchar *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          iVar2);
    if (local_4 < 0) {
      local_4 = -1;
    }
    else {
      local_4 = local_4 + 1;
    }
  }
  else {
    iVar1 = (in_RCX.asn1_string)->type;
    io_ch_00 = in_RCX;
    iVar2 = i2d_ASN1_TYPE((ASN1_TYPE *)&stack0xffffffffffffffc8,(uchar **)0x0);
    if (iVar2 < 1) {
      local_4 = -1;
    }
    else {
      file = (char *)CRYPTO_malloc(iVar2,"crypto/asn1/a_strex.c",0x11d);
      if (file == (char *)0x0) {
        ERR_new();
        ERR_set_debug(file,line,(char *)CONCAT44(in_stack_ffffffffffffffb4,iVar2));
        ERR_set_error(0xd,0xc0100,(char *)0x0);
        local_4 = -1;
      }
      else {
        i2d_ASN1_TYPE((ASN1_TYPE *)&stack0xffffffffffffffc8,(uchar **)&stack0xffffffffffffffb8);
        local_4 = do_hex_dump((char_io *)io_ch_00.ptr,in_RCX.ptr,
                              (uchar *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),
                              (int)((ulong)file >> 0x20));
        CRYPTO_free(file);
        if (local_4 < 0) {
          local_4 = -1;
        }
        else {
          local_4 = local_4 + 1;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int do_dump(unsigned long lflags, char_io *io_ch, void *arg,
                   const ASN1_STRING *str)
{
    /*
     * Placing the ASN1_STRING in a temp ASN1_TYPE allows the DER encoding to
     * readily obtained
     */
    ASN1_TYPE t;
    unsigned char *der_buf, *p;
    int outlen, der_len;

    if (!io_ch(arg, "#", 1))
        return -1;
    /* If we don't dump DER encoding just dump content octets */
    if (!(lflags & ASN1_STRFLGS_DUMP_DER)) {
        outlen = do_hex_dump(io_ch, arg, str->data, str->length);
        if (outlen < 0)
            return -1;
        return outlen + 1;
    }
    t.type = str->type;
    t.value.ptr = (char *)str;
    der_len = i2d_ASN1_TYPE(&t, NULL);
    if (der_len <= 0)
        return -1;
    if ((der_buf = OPENSSL_malloc(der_len)) == NULL) {
        ERR_raise(ERR_LIB_ASN1, ERR_R_MALLOC_FAILURE);
        return -1;
    }
    p = der_buf;
    i2d_ASN1_TYPE(&t, &p);
    outlen = do_hex_dump(io_ch, arg, der_buf, der_len);
    OPENSSL_free(der_buf);
    if (outlen < 0)
        return -1;
    return outlen + 1;
}